

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copyto.cpp
# Opt level: O2

void ncnn::copy_to_image<signed_char>(Mat *src,Mat *self,int top,int left)

{
  int iVar1;
  int iVar2;
  void *__dest;
  void *__src;
  bool bVar3;
  
  iVar1 = src->w;
  __src = src->data;
  __dest = (void *)((long)self->data + (long)left + (long)top * (long)self->w * self->elemsize);
  iVar2 = 0;
  if (0 < src->h) {
    iVar2 = src->h;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    memcpy(__dest,__src,(long)iVar1);
    __src = (void *)((long)__src + (long)iVar1);
    __dest = (void *)((long)__dest + (long)self->w);
  }
  return;
}

Assistant:

static void copy_to_image(const Mat& src, Mat& self, int top, int left)
{
    int w = src.w;
    int h = src.h;

    const T* ptr = src;
    T* outptr = self.row<T>(top) + left;

    for (int y = 0; y < h; y++)
    {
        memcpy(outptr, ptr, w * sizeof(T));
        ptr += w;
        outptr += self.w;
    }
}